

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessHadOutput
          (BuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,StringRef data)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  unique_lock<std::mutex> lock;
  BuildSystemFrontendDelegateImpl *impl;
  Command *command_local;
  BuildSystemFrontendDelegate *this_local;
  StringRef data_local;
  ProcessHandle handle_local;
  
  data_local.Data = (char *)data.Length;
  this_local = (BuildSystemFrontendDelegate *)data.Data;
  lock._8_8_ = this->impl;
  data_local.Length = handle.id;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&buffer,(mutex_type *)(lock._8_8_ + 0x50));
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
            llvm::
            DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator[]((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)(lock._8_8_ + 0x38),&data_local.Length);
  local_50 = this_00;
  local_60._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_58,&local_60);
  __first = llvm::StringRef::begin((StringRef *)&this_local);
  __last = llvm::StringRef::end((StringRef *)&this_local);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
            (this_00,local_58,__first,__last);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&buffer);
  return;
}

Assistant:

void BuildSystemFrontendDelegate::
commandProcessHadOutput(Command* command, ProcessHandle handle,
                        StringRef data) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  std::unique_lock<std::mutex> lock(impl->processOutputBuffersMutex);

  // Append to the output buffer.
  auto& buffer = impl->processOutputBuffers[handle.id];
  buffer.insert(buffer.end(), data.begin(), data.end());
}